

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O0

int mbedtls_ecjpake_read_round_one(mbedtls_ecjpake_context *ctx,uchar *buf,size_t len)

{
  int iVar1;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ecjpake_context *ctx_local;
  
  iVar1 = ecjpake_kkpp_read(ctx->md_type,&ctx->grp,ctx->point_format,&(ctx->grp).G,&ctx->Xp1,
                            &ctx->Xp2,ecjpake_id[1 - ctx->role],buf,len);
  return iVar1;
}

Assistant:

int mbedtls_ecjpake_read_round_one(mbedtls_ecjpake_context *ctx,
                                   const unsigned char *buf,
                                   size_t len)
{
    return ecjpake_kkpp_read(ctx->md_type, &ctx->grp, ctx->point_format,
                             &ctx->grp.G,
                             &ctx->Xp1, &ctx->Xp2, ID_PEER,
                             buf, len);
}